

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64.c
# Opt level: O3

uint64_t roaring64_bitmap_rank(roaring64_bitmap_t *r,uint64_t val)

{
  ushort uVar1;
  uint uVar2;
  art_val_t *paVar3;
  art_key_chunk_t aVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint64_t uVar8;
  uint16_t x;
  run_container_t *prVar9;
  uint64_t unaff_R13;
  leaf_t *leaf;
  uint8_t high48 [6];
  art_iterator_t it;
  uint local_c0;
  ushort local_bc;
  art_iterator_t local_b8;
  
  local_c0 = (uint)(byte)(val >> 0x38) | (uint)((val & 0xff00000000ffff) >> 0x28) |
             (uint)(val >> 0x18) & 0xff0000 | (uint)(val >> 8) & 0xff000000;
  local_bc = (ushort)(val >> 0x18) & 0xff | (ushort)(val >> 8) & 0xff00;
  art_init_iterator(&local_b8,&r->art,true);
  uVar8 = 0;
  do {
    paVar3 = local_b8.value;
    if (local_b8.value == (art_val_t *)0x0) {
      return uVar8;
    }
    iVar5 = art_compare_keys(local_b8.key,(art_key_chunk_t *)&local_c0);
    if (iVar5 < 0) {
      prVar9 = *(run_container_t **)(paVar3[1].key + 2);
      aVar4 = paVar3[1].key[0];
      if (aVar4 == '\x04') {
        aVar4 = *(art_key_chunk_t *)&prVar9->runs;
        prVar9 = *(run_container_t **)prVar9;
      }
      if (aVar4 == '\x03') {
        iVar7 = run_container_cardinality(prVar9);
      }
      else {
        iVar7 = prVar9->n_runs;
      }
      uVar8 = uVar8 + (long)iVar7;
      art_iterator_next(&local_b8);
    }
    else {
      if (iVar5 != 0) {
        return uVar8;
      }
      prVar9 = *(run_container_t **)(paVar3[1].key + 2);
      aVar4 = paVar3[1].key[0];
      if (aVar4 == '\x04') {
        aVar4 = *(art_key_chunk_t *)&prVar9->runs;
        prVar9 = *(run_container_t **)prVar9;
      }
      x = (uint16_t)(val & 0xff00000000ffff);
      if (aVar4 == '\x03') {
        iVar7 = run_container_rank(prVar9,x);
      }
      else if (aVar4 == '\x02') {
        if (prVar9->n_runs < 1) {
          iVar7 = 0;
        }
        else {
          iVar7 = prVar9->n_runs + -1;
          iVar6 = 0;
          do {
            uVar2 = (uint)(iVar7 + iVar6) >> 1;
            uVar1 = *(ushort *)((long)&prVar9->runs->value + (ulong)(iVar7 + iVar6 & 0xfffffffe));
            if (uVar1 < (ushort)val) {
              iVar6 = uVar2 + 1;
            }
            else {
              if (uVar1 <= (ushort)val) {
                iVar7 = uVar2 + 1;
                goto LAB_0010a01d;
              }
              iVar7 = uVar2 - 1;
            }
          } while (iVar6 <= iVar7);
          iVar7 = -iVar6;
          if (0 < iVar6) {
            iVar7 = iVar6;
          }
        }
      }
      else {
        iVar7 = bitset_container_rank((bitset_container_t *)prVar9,x);
      }
LAB_0010a01d:
      unaff_R13 = (long)iVar7 + uVar8;
    }
    if (-1 < iVar5) {
      return unaff_R13;
    }
  } while( true );
}

Assistant:

uint64_t roaring64_bitmap_rank(const roaring64_bitmap_t *r, uint64_t val) {
    uint8_t high48[ART_KEY_BYTES];
    uint16_t low16 = split_key(val, high48);

    art_iterator_t it = art_init_iterator(&r->art, /*first=*/true);
    uint64_t rank = 0;
    while (it.value != NULL) {
        leaf_t *leaf = (leaf_t *)it.value;
        int compare_result = compare_high48(it.key, high48);
        if (compare_result < 0) {
            rank += container_get_cardinality(leaf->container, leaf->typecode);
        } else if (compare_result == 0) {
            return rank +
                   container_rank(leaf->container, leaf->typecode, low16);
        } else {
            return rank;
        }
        art_iterator_next(&it);
    }
    return rank;
}